

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O1

void Abc_ObjRemoveFanins(Abc_Obj_t *pObj)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  lVar3 = (long)(pObj->vFanins).nSize;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    do {
      iVar1 = (pObj->vFanins).pArray[lVar3 + -2];
      if (((long)iVar1 < 0) || (pVVar2 = pObj->pNtk->vObjs, pVVar2->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Abc_ObjDeleteFanin(pObj,(Abc_Obj_t *)pVVar2->pArray[iVar1]);
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  pObj->field_0x15 = pObj->field_0x15 & 0xf3;
  if ((pObj->vFanins).nSize == 0) {
    return;
  }
  __assert_fail("vFaninsOld->nSize == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                ,0x9b,"void Abc_ObjRemoveFanins(Abc_Obj_t *)");
}

Assistant:

void Abc_ObjRemoveFanins( Abc_Obj_t * pObj )
{
    Vec_Int_t * vFaninsOld;
    Abc_Obj_t * pFanin;
    int k;
    // remove old fanins
    vFaninsOld = &pObj->vFanins;
    for ( k = vFaninsOld->nSize - 1; k >= 0; k-- )
    {
        pFanin = Abc_NtkObj( pObj->pNtk, vFaninsOld->pArray[k] );
        Abc_ObjDeleteFanin( pObj, pFanin );
    }
    pObj->fCompl0 = 0;
    pObj->fCompl1 = 0;
    assert( vFaninsOld->nSize == 0 );
}